

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O0

type * Disa::operator+(type *__return_storage_ptr__,Matrix_Dense<double,_0UL,_0UL> *matrix_0,
                      Matrix_Dense<double,_0UL,_0UL> *matrix_1)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  size_t column;
  source_location *in_RCX;
  anon_class_16_2_f0a71eda local_228;
  function<double_(unsigned_long,_unsigned_long)> local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined **local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  pair<unsigned_long,_unsigned_long> local_40;
  pair<unsigned_long,_unsigned_long> local_30;
  Matrix_Dense<double,_0UL,_0UL> *local_20;
  Matrix_Dense<double,_0UL,_0UL> *matrix_1_local;
  Matrix_Dense<double,_0UL,_0UL> *matrix_0_local;
  
  local_20 = matrix_1;
  matrix_1_local = matrix_0;
  matrix_0_local = __return_storage_ptr__;
  local_30 = Matrix_Dense<double,_0UL,_0UL>::size(matrix_0);
  local_40 = Matrix_Dense<double,_0UL,_0UL>::size(local_20);
  bVar1 = std::operator==(&local_30,&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_228.matrix_0 = matrix_1_local;
    local_228.matrix_1 = local_20;
    std::function<double(unsigned_long,unsigned_long)>::operator+
              ((function<double(unsigned_long,unsigned_long)> *)&local_218,&local_228);
    sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_row(matrix_1_local);
    column = Matrix_Dense<double,_0UL,_0UL>::size_column(matrix_1_local);
    Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense(__return_storage_ptr__,&local_218,sVar3,column);
    std::function<double_(unsigned_long,_unsigned_long)>::~function(&local_218);
    return __return_storage_ptr__;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
  local_68 = &PTR_s__workspace_llm4binary_github_lic_001ee188;
  console_format_abi_cxx11_(&local_60,(Disa *)0x0,(Log_Level)&local_68,in_RCX);
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_row(matrix_1_local);
  std::__cxx11::to_string(&local_198,sVar3);
  std::operator+(&local_178,"Incompatible matrix dimensions, ",&local_198);
  std::operator+(&local_158,&local_178,",");
  sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_column(matrix_1_local);
  std::__cxx11::to_string(&local_1b8,sVar3);
  std::operator+(&local_138,&local_158,&local_1b8);
  std::operator+(&local_118,&local_138," vs. ");
  sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_row(local_20);
  std::__cxx11::to_string(&local_1d8,sVar3);
  std::operator+(&local_f8,&local_118,&local_1d8);
  std::operator+(&local_d8,&local_f8,",");
  sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_column(local_20);
  std::__cxx11::to_string(&local_1f8,sVar3);
  std::operator+(&local_b8,&local_d8,&local_1f8);
  std::operator+(&local_98,&local_b8,".");
  poVar2 = std::operator<<(poVar2,(string *)&local_98);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_60);
  exit(1);
}

Assistant:

typename Static_Promoter<Matrix_Dense<_type, _row_0, _col_0>, Matrix_Dense<_type, _row_1, _col_1>>::type constexpr
operator+(const Matrix_Dense<_type, _row_0, _col_0>& matrix_0, const Matrix_Dense<_type, _row_1, _col_1>& matrix_1) {
  ASSERT_DEBUG(matrix_0.size() == matrix_1.size(),
               "Incompatible matrix dimensions, " + std::to_string(matrix_0.size_row()) + "," +
               std::to_string(matrix_0.size_column()) + " vs. " + std::to_string(matrix_1.size_row()) + "," +
               std::to_string(matrix_1.size_column()) + ".");
  typedef typename Static_Promoter<Matrix_Dense<_type, _row_0, _col_0>, Matrix_Dense<_type, _row_1, _col_1>>::type
  _return_matrix;
  return _return_matrix(
  [&](std::size_t i_row, std::size_t i_column) { return matrix_0[i_row][i_column] + matrix_1[i_row][i_column]; },
  matrix_0.size_row(), matrix_0.size_column());
}